

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O0

void __thiscall
adios2sys::Encoding::CommandLineArguments::CommandLineArguments
          (CommandLineArguments *this,CommandLineArguments *other)

{
  size_type sVar1;
  const_reference ppcVar2;
  reference ppcVar3;
  vector<char_*,_std::allocator<char_*>_> *in_RSI;
  vector<char_*,_std::allocator<char_*>_> *in_RDI;
  size_t i;
  undefined8 local_48;
  vector<char_*,_std::allocator<char_*>_> *this_00;
  undefined8 local_28;
  
  this_00 = in_RDI;
  std::vector<char_*,_std::allocator<char_*>_>::vector
            ((vector<char_*,_std::allocator<char_*>_> *)0xf2f955);
  std::vector<char_*,_std::allocator<char_*>_>::size(in_RSI);
  std::vector<char_*,_std::allocator<char_*>_>::resize(this_00,(size_type)in_RDI);
  local_28 = 0;
  while( true ) {
    sVar1 = std::vector<char_*,_std::allocator<char_*>_>::size(in_RDI);
    if (sVar1 <= local_28) break;
    ppcVar2 = std::vector<char_*,_std::allocator<char_*>_>::operator[](in_RSI,local_28);
    if (*ppcVar2 == (value_type)0x0) {
      local_48 = (char *)0x0;
    }
    else {
      ppcVar2 = std::vector<char_*,_std::allocator<char_*>_>::operator[](in_RSI,local_28);
      local_48 = strdup(*ppcVar2);
    }
    ppcVar3 = std::vector<char_*,_std::allocator<char_*>_>::operator[](in_RDI,local_28);
    *ppcVar3 = local_48;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

Encoding::CommandLineArguments::CommandLineArguments(
  const CommandLineArguments& other)
{
  this->argv_.resize(other.argv_.size());
  for (size_t i = 0; i < this->argv_.size(); i++) {
    this->argv_[i] = other.argv_[i] ? strdup(other.argv_[i]) : nullptr;
  }
}